

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * createstrobj(lua_State *L,size_t l,int tag,uint h)

{
  TString *pTVar1;
  
  pTVar1 = (TString *)luaC_newobj(L,tag,l + 0x19);
  if ((pTVar1->tt & 0xf) == 4) {
    pTVar1->hash = h;
    pTVar1->extra = '\0';
    *(undefined1 *)((long)&pTVar1[1].next + l) = 0;
    return pTVar1;
  }
  __assert_fail("(((o)->tt) & 0x0F) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                ,0x8b,"TString *createstrobj(lua_State *, size_t, int, unsigned int)");
}

Assistant:

static TString *createstrobj (lua_State *L, size_t l, int tag, unsigned int h) {
  TString *ts;
  GCObject *o;
  size_t totalsize;  /* total size of TString object */
  totalsize = sizelstring(l);
  o = luaC_newobj(L, tag, totalsize);
  ts = gco2ts(o);
  ts->hash = h;
  ts->extra = 0;
  getstr(ts)[l] = '\0';  /* ending 0 */
  return ts;
}